

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSetImplement.h
# Opt level: O2

void * __thiscall
BitSetImplement<std::bitset<128UL>,_KDefectiveSimple>::neighborSetOf
          (BitSetImplement<std::bitset<128UL>,_KDefectiveSimple> *this,int idx)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer piVar2;
  bitset<128UL> *this_00;
  int i;
  ulong uVar3;
  
  this_00 = (bitset<128UL> *)operator_new(0x10);
  (this_00->super__Base_bitset<2UL>)._M_w[0] = 0;
  (this_00->super__Base_bitset<2UL>)._M_w[1] = 0;
  for (uVar3 = 0; pvVar1 = (this->super_KDefectiveSimple).super_KDefectiveBase.from,
      piVar2 = pvVar1[idx].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)pvVar1[idx].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar2 >> 2);
      uVar3 = uVar3 + 1) {
    std::bitset<128UL>::set(this_00,(long)piVar2[uVar3],true);
  }
  return this_00;
}

Assistant:

void* BitSetImplement<Bitset, Base>::neighborSetOf(int idx) {
	Bitset *__Nei__ = new Bitset();
	for (int i = 0; i < from[idx].size(); i++) {
		int to = from[idx][i];
		__Nei__ -> set(to);
	}
	return __Nei__;
}